

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_decode_mnt(pt_event_decoder *decoder,pt_packet_mnt *packet)

{
  pt_event *ev_00;
  int errcode;
  pt_event *ev;
  pt_packet_mnt *packet_local;
  pt_event_decoder *decoder_local;
  
  if ((decoder == (pt_event_decoder *)0x0) || (packet == (pt_packet_mnt *)0x0)) {
    decoder_local._4_4_ = -1;
  }
  else {
    ev_00 = pt_evq_standalone(&decoder->evq);
    decoder->event = ev_00;
    if (ev_00 == (pt_event *)0x0) {
      decoder_local._4_4_ = -1;
    }
    else {
      ev_00->type = ptev_mnt;
      (ev_00->variant).disabled.ip = packet->payload;
      decoder_local._4_4_ = pt_evt_event_time(ev_00,&decoder->time);
      if (-1 < decoder_local._4_4_) {
        decoder_local._4_4_ = pt_evt_fetch_packet(decoder);
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_evt_decode_mnt(struct pt_event_decoder *decoder,
			      const struct pt_packet_mnt *packet)
{
	struct pt_event *ev;
	int errcode;

	if (!decoder || !packet)
		return -pte_internal;

	decoder->event = ev = pt_evq_standalone(&decoder->evq);
	if (!ev)
		return -pte_internal;

	ev->type = ptev_mnt;
	ev->variant.mnt.payload = packet->payload;

	errcode = pt_evt_event_time(ev, &decoder->time);
	if (errcode < 0)
		return errcode;

	return pt_evt_fetch_packet(decoder);
}